

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O2

Mzp * patch_string_table(Mzp *__return_storage_ptr__,json *translation_db,Mzp *mzp_archive)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  const_reference pvVar5;
  const_reference this_00;
  undefined8 uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  undefined1 data [8];
  pointer pbVar8;
  string local_150;
  string local_130;
  undefined1 local_110 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  original_strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translated_strings;
  undefined1 local_a8 [8];
  string new_text_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> new_text_offsets;
  undefined1 local_60 [8];
  string serialized_new_offsets;
  Mzp *ret;
  uint32_t text_write_offset;
  
  uVar4 = (long)(mzp_archive->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(mzp_archive->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)translation_db;
  serialized_new_offsets.field_2._8_8_ = __return_storage_ptr__;
  if ((long)uVar4 >> 3 !=
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if ((uVar4 & 8) != 0) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar7 = 0; uVar4 = (ulong)uVar7,
      uVar4 < (ulong)((long)(mzp_archive->entry_headers).
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mzp_archive->entry_headers).
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 2) {
    parse_offset_table((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,
                       (mzp_archive->entry_data).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar4);
    extract_string_table
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e0,
               (mzp_archive->entry_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar7 | 1),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
    fprintf(_stderr,"Loaded %lu strings from tables %u+%u\n",
            (long)original_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)local_e0 >> 5,uVar4,
            (ulong)(uVar7 | 1));
    pbVar8 = original_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    original_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (data = local_e0; data != (undefined1  [8])pbVar8;
        data = (undefined1  [8])((long)data + 0x20)) {
      mg::util::sha256((string *)local_60,(string *)data);
      mg::string::bytes_to_hex((string *)local_a8,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::string((string *)local_60,(string *)data);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          "script_text_by_hash");
      bVar3 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                        (pvVar5,(string *)local_a8);
      if (bVar3) {
        this_00 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[](pvVar5,(string *)local_a8);
        bVar3 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          (this_00,&TARGET_LANGUAGE_abi_cxx11_);
        if (bVar3) {
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar5,(string *)local_a8);
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar5,&TARGET_LANGUAGE_abi_cxx11_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((undefined1 *)((long)&new_text_data.field_2 + 8),pvVar5);
          if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            std::__cxx11::string::_M_assign((string *)local_60);
          }
          std::__cxx11::string::~string((string *)(new_text_data.field_2._M_local_buf + 8));
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &original_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)local_a8);
    }
    local_a8 = (undefined1  [8])&new_text_data._M_string_length;
    new_text_data._M_dataplus._M_p = (pointer)0x0;
    ret._4_4_ = 0;
    new_text_data.field_2._8_8_ = 0;
    new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_text_data._M_string_length._0_1_ = 0;
    for (pbVar8 = original_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pbVar8 = pbVar8 + 1) {
      std::operator+((string *)local_60,pbVar8,"\r\n");
      std::__cxx11::string::resize((ulong)local_a8);
      memcpy((pointer)((long)local_a8 + (ulong)ret._4_4_),(void *)local_60,
             (size_t)serialized_new_offsets._M_dataplus._M_p);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (new_text_data.field_2._M_local_buf + 8),(uint *)((long)&ret + 4));
      ret._4_4_ = ret._4_4_ + (int)serialized_new_offsets._M_dataplus._M_p;
      std::__cxx11::string::~string((string *)local_60);
    }
    local_60 = (undefined1  [8])new_text_data._M_dataplus._M_p;
    this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (&new_text_data.field_2._M_allocated_capacity + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
              (this,(unsigned_long *)local_60);
    local_60 = (undefined1  [8])new_text_data._M_dataplus._M_p;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
              (this,(unsigned_long *)local_60);
    local_60._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this,(uint *)local_60);
    local_60._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this,(uint *)local_60);
    local_60._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this,(uint *)local_60);
    local_60 = (undefined1  [8])&serialized_new_offsets._M_string_length;
    serialized_new_offsets._M_dataplus._M_p = (pointer)0x0;
    serialized_new_offsets._M_string_length._0_1_ = 0;
    std::__cxx11::string::resize((ulong)local_60);
    uVar4 = 0;
    for (uVar6 = new_text_data.field_2._8_8_; (uint *)uVar6 != (uint *)0x0; uVar6 = uVar6 + 4) {
      uVar1 = *(uint *)uVar6;
      *(uint *)((long)local_60 + (uVar4 & 0xffffffff)) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar4 = (uVar4 & 0xffffffff) + 4;
    }
    std::__cxx11::string::string((string *)&local_150,(string *)local_60);
    mg::data::Mzp::add_entry((Mzp *)serialized_new_offsets.field_2._8_8_,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string((string *)&local_130,(string *)local_a8);
    mg::data::Mzp::add_entry((Mzp *)serialized_new_offsets.field_2._8_8_,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&original_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
  }
  return (Mzp *)serialized_new_offsets.field_2._8_8_;
}

Assistant:

mg::data::Mzp patch_string_table(const nlohmann::json &translation_db,
                                 const mg::data::Mzp mzp_archive) {
  // The MZP archive consists of N pairs of string offset table + string data
  // table. For each pair, iterate the string table, extract the string, hash
  // it, check if the translated string exists, and if so inject the translated
  // string instead.
  ASSERT(mzp_archive.entry_headers.size() == mzp_archive.entry_data.size());
  ASSERT(mzp_archive.entry_headers.size() % 2 == 0);

  // Return MZP
  mg::data::Mzp ret;

  for (unsigned i = 0; i < mzp_archive.entry_headers.size(); i += 2) {
    const unsigned offset_table_idx = i;
    const unsigned string_table_idx = i + 1;

    // Extract original strings
    const std::vector<uint32_t> offsets =
        parse_offset_table(mzp_archive.entry_data[offset_table_idx]);
    const std::vector<std::string> original_strings =
        extract_string_table(mzp_archive.entry_data[string_table_idx], offsets);
    fprintf(stderr, "Loaded %lu strings from tables %u+%u\n",
            original_strings.size(), offset_table_idx, string_table_idx);

    // Iterate the strings, and replace any translated ones with the appropriate
    // text
    std::vector<std::string> translated_strings;
    for (auto &line : original_strings) {
      // Hash the line
      const std::string line_digest_hex =
          mg::string::bytes_to_hex(mg::util::sha256(line));

      // If we find nothing, fall back to the original text
      std::string line_to_insert = line;

      // Is this hash in our TL DB?
      auto &script_text_by_hash = translation_db["script_text_by_hash"];
      if (script_text_by_hash.contains(line_digest_hex)) {
        if (script_text_by_hash[line_digest_hex].contains(TARGET_LANGUAGE)) {
          const std::string translated_line =
              script_text_by_hash[line_digest_hex][TARGET_LANGUAGE];
          if (translated_line.size() > 0) {
            // We have a translation
            line_to_insert = translated_line;
          }
        }
      }

      // Append the line to our output vector
      translated_strings.emplace_back(line_to_insert);
    }

    // Now that we have a vector of translated strings, we need to insert them
    // back into the MZP and update the offset table.
    // Note that during reinsertion, we re-add the \r\n escape sequence at the
    // end of each line
    std::vector<uint32_t> new_text_offsets;
    std::string new_text_data;
    uint32_t text_write_offset = 0;
    for (auto &line : translated_strings) {
      // Append \r\n
      const std::string padded_line = line + "\r\n";

      // Append this string to our buffer
      new_text_data.resize(new_text_data.size() + padded_line.size());
      memcpy(&new_text_data[text_write_offset], padded_line.data(),
             padded_line.size());

      // Add that offset for this string to the offset table
      new_text_offsets.emplace_back(text_write_offset);

      // Increment the write pointer by the size of the string
      text_write_offset += padded_line.size();
    }

    // For some reason, the offsets seem to include 2 instances of offsets that
    // point to the final byte of the string table. Recreate them here in case
    // the game actually needs this info.
    new_text_offsets.emplace_back(new_text_data.size());
    new_text_offsets.emplace_back(new_text_data.size());

    // The offset table ends with 12 bytes of 0xFF
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);

    // Now that we have the new string data, and the new list of offsets, pack
    // the list of offsets back into a byte array
    std::string serialized_new_offsets;
    serialized_new_offsets.resize(new_text_offsets.size() * sizeof(uint32_t));
    uint32_t offset_write_offset = 0;
    for (uint32_t offset : new_text_offsets) {
      const uint32_t be_offset = mg::host_to_be_u32(offset);
      memcpy(&serialized_new_offsets[offset_write_offset], &be_offset,
             sizeof(be_offset));
      offset_write_offset += sizeof(uint32_t);
    }

    // Add the new segments to our output MZP
    ret.add_entry(serialized_new_offsets);
    ret.add_entry(new_text_data);
  }

  return ret;
}